

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall FakeOutput::FakeOutput(FakeOutput *this)

{
  FakeOutput *this_local;
  
  SimpleString::SimpleString(&this->file,"");
  SimpleString::SimpleString(&this->console,"");
  this->SaveFOpen = PlatformSpecificFOpen;
  this->SaveFPuts = PlatformSpecificFPuts;
  this->SaveFClose = PlatformSpecificFClose;
  installFakes(this);
  currentFake = this;
  return;
}

Assistant:

FakeOutput() : SaveFOpen(PlatformSpecificFOpen), SaveFPuts(PlatformSpecificFPuts),
        SaveFClose(PlatformSpecificFClose)
    {
        installFakes();
        currentFake = this;
    }